

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cc
# Opt level: O0

ts_nsec timed_fdb_commit(fdb_file_handle *fhandle,bool walflush)

{
  ts_nsec start_00;
  ts_nsec end_00;
  byte in_SIL;
  fdb_status status;
  ts_nsec end;
  ts_nsec start;
  fdb_file_handle *in_stack_ffffffffffffffc8;
  undefined4 local_2c;
  undefined8 local_8;
  
  start_00 = get_monotonic_ts();
  if ((in_SIL & 1) == 0) {
    local_2c = fdb_commit(in_stack_ffffffffffffffc8,'\0');
  }
  else {
    local_2c = fdb_commit(in_stack_ffffffffffffffc8,'\0');
  }
  end_00 = get_monotonic_ts();
  if (local_2c == FDB_RESULT_SUCCESS) {
    local_8 = ts_diff(start_00,end_00);
  }
  else {
    local_8 = 0xffffffff;
  }
  return local_8;
}

Assistant:

ts_nsec timed_fdb_commit(fdb_file_handle *fhandle, bool walflush){

  ts_nsec start, end;
  fdb_status status;

  start = get_monotonic_ts();
  if(walflush){
    status = fdb_commit(fhandle, FDB_COMMIT_MANUAL_WAL_FLUSH);
  } else {
    status = fdb_commit(fhandle, FDB_COMMIT_NORMAL);
  }

  end = get_monotonic_ts();

  if(status == FDB_RESULT_SUCCESS){
    return ts_diff(start, end);
  } else {
    return ERR_NS;
  }
}